

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

void faup_output_show_buffer
               (faup_handler_t *fh,faup_options_t *opts,faup_feature_t feature,char *buffer,
               int *buffer_pos,int escape_dquotes)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  uint uVar3;
  ulong uVar4;
  
  uVar3 = feature.size;
  iVar1 = faup_features_exist(feature);
  __stream = _stderr;
  if (iVar1 != 0) {
    if (0x2000 < uVar3) {
      pcVar2 = faup_features_get_field_name(feature);
      fprintf(__stream,
              "Error: field(%s) with size(%d) is greater than the maximum default FAUP URL MAXLEN (%d). Cannot process the given url (%s).\n"
              ,pcVar2,(ulong)uVar3,0x2000,(fh->faup).org_str);
      return;
    }
    if (uVar3 != 0) {
      pcVar2 = (fh->faup).org_str;
      uVar4 = 0;
      do {
        if ((escape_dquotes != 0) && (pcVar2[uVar4 + (feature._0_8_ >> 0x20)] == '\"')) {
          buffer[*buffer_pos] = '\\';
          iVar1 = *buffer_pos;
          *buffer_pos = iVar1 + 1;
          buffer[iVar1 + 1] = '\0';
        }
        buffer[*buffer_pos] = (fh->faup).org_str[(uint)(feature.pos + (int)uVar4)];
        iVar1 = *buffer_pos;
        *buffer_pos = iVar1 + 1;
        buffer[iVar1 + 1] = '\0';
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
  }
  return;
}

Assistant:

void faup_output_show_buffer(faup_handler_t const* fh, faup_options_t *opts, const faup_feature_t feature, char *buffer, int *buffer_pos, int escape_dquotes)
{

	if (faup_features_exist(feature)) {
		uint32_t counter = 0;
		const char *tmpbuf = NULL;
		tmpbuf = &fh->faup.org_str[feature.pos];

		if (feature.size > FAUP_MAXLEN) {
			fprintf(stderr, "Error: field(%s) with size(%d) is greater than the maximum default FAUP URL MAXLEN (%d). Cannot process the given url (%s).\n",
				faup_features_get_field_name(feature), feature.size, FAUP_MAXLEN, fh->faup.org_str);
			return;
		}

		while (counter < feature.size) {
			if (escape_dquotes) {
				if (tmpbuf[counter] == '"') {
					faup_output_buffer_append(buffer, buffer_pos, "\\", 1);
				}
			}

			// printf("tmpbuf:%c\n", tmpbuf[counter]);
			faup_output_buffer_append(buffer, buffer_pos, &fh->faup.org_str[feature.pos+counter], 1);

			counter++;
		}

	}
}